

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O3

void glcts::preparePositionForFace
               (GLfloat *positions,GLuint cube_face,GLuint element_index,GLuint n_layers)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = 2.0 / (float)(n_layers * 3);
  fVar3 = (float)((cube_face + element_index * 6) * 3) * fVar1 + fVar1 * 0.5 + -1.0;
  fVar2 = fVar1 + fVar3;
  fVar1 = fVar1 + fVar2;
  *positions = fVar3;
  positions[1] = 0.6666666;
  positions[2] = 0.0;
  positions[3] = 1.0;
  positions[4] = fVar2;
  positions[5] = 0.6666666;
  positions[6] = 0.0;
  positions[7] = 1.0;
  positions[8] = fVar1;
  positions[9] = 0.6666666;
  positions[10] = 0.0;
  positions[0xb] = 1.0;
  positions[0xc] = fVar3;
  positions[0xd] = -5.9604645e-08;
  positions[0xe] = 0.0;
  positions[0xf] = 1.0;
  positions[0x10] = fVar2;
  positions[0x11] = -5.9604645e-08;
  positions[0x12] = 0.0;
  positions[0x13] = 1.0;
  positions[0x14] = fVar1;
  positions[0x15] = -5.9604645e-08;
  positions[0x16] = 0.0;
  positions[0x17] = 1.0;
  positions[0x18] = fVar3;
  positions[0x19] = -0.66666675;
  positions[0x1a] = 0.0;
  positions[0x1b] = 1.0;
  positions[0x1c] = fVar2;
  positions[0x1d] = -0.66666675;
  positions[0x1e] = 0.0;
  positions[0x1f] = 1.0;
  positions[0x20] = fVar1;
  positions[0x21] = -0.66666675;
  positions[0x22] = 0.0;
  positions[0x23] = 1.0;
  return;
}

Assistant:

void preparePositionForFace(glw::GLfloat* positions, glw::GLuint cube_face, glw::GLuint element_index,
							glw::GLuint n_layers)
{
	static const glw::GLuint x_offset_per_face = 3;
	static const glw::GLuint n_faces		   = 6;

	const glw::GLuint x_offset_for_face = (element_index * n_faces + cube_face) * x_offset_per_face;

	const glw::GLfloat x_step	 = 2.0f / ((glw::GLfloat)(n_layers * 3));
	const glw::GLfloat x_mid_step = x_step / 2.0f;
	const glw::GLfloat y_step	 = 2.0f / 3.0f;
	const glw::GLfloat y_mid_step = y_step / 2.0f;

	const glw::GLfloat x_left   = -1.0f + x_mid_step + ((glw::GLfloat)x_offset_for_face) * x_step;
	const glw::GLfloat x_middle = x_left + x_step;
	const glw::GLfloat x_right  = x_middle + x_step;

	const glw::GLfloat y_top	= 1.0f - y_mid_step;
	const glw::GLfloat y_middle = y_top - y_step;
	const glw::GLfloat y_bottom = y_middle - y_step;

	vectorSet4(positions, 0, x_left, y_top, 0.0f, 1.0f);
	vectorSet4(positions, 1, x_middle, y_top, 0.0f, 1.0f);
	vectorSet4(positions, 2, x_right, y_top, 0.0f, 1.0f);
	vectorSet4(positions, 3, x_left, y_middle, 0.0f, 1.0f);
	vectorSet4(positions, 4, x_middle, y_middle, 0.0f, 1.0f);
	vectorSet4(positions, 5, x_right, y_middle, 0.0f, 1.0f);
	vectorSet4(positions, 6, x_left, y_bottom, 0.0f, 1.0f);
	vectorSet4(positions, 7, x_middle, y_bottom, 0.0f, 1.0f);
	vectorSet4(positions, 8, x_right, y_bottom, 0.0f, 1.0f);
}